

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Translator_X86.cpp
# Opt level: O2

int x86MOV(uchar *stream,x86Reg dst,x86Size size,x86Reg index,int multiplier,x86Reg base,int shift)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  
  if (size - sDWORD < 2) {
    uVar1 = encodeRex(stream,size == sQWORD,dst,index,base);
    puVar3 = stream + uVar1;
    if ((dst == rEAX) && ((base == rNONE && index == rNONE) && (char)shift != shift)) {
      *puVar3 = 0xa1;
      *(int *)(puVar3 + 1) = shift;
      iVar2 = (int)puVar3 + 5;
    }
    else {
      *puVar3 = 0x8b;
      uVar1 = encodeAddress(puVar3 + 1,index,multiplier,base,shift,(int)regCode[dst]);
      iVar2 = (int)puVar3 + uVar1 + 1;
    }
    return iVar2 - (int)stream;
  }
  __assert_fail("size == sDWORD || size == sQWORD",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Translator_X86.cpp"
                ,0x350,"int x86MOV(unsigned char *, x86Reg, x86Size, x86Reg, int, x86Reg, int)");
}

Assistant:

int x86MOV(unsigned char *stream, x86Reg dst, x86Size size, x86Reg index, int multiplier, x86Reg base, int shift)
{
	unsigned char *start = stream;

	assert(size == sDWORD || size == sQWORD);

	stream += encodeRex(stream, size == sQWORD, dst, index, base);

	if(dst == rEAX && (char)(shift) != shift && index == rNONE && base == rNONE)
	{
		*stream++ = 0xa1;
		stream += encodeImmDword(stream, shift);

		return int(stream - start);
	}

	*stream++ = 0x8b;
	stream += encodeAddress(stream, index, multiplier, base, shift, regCode[dst]);

	return int(stream - start);
}